

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteArray.cpp
# Opt level: O2

ByteArray * __thiscall ByteArray::operator=(ByteArray *this,ByteArray *other)

{
  size_t sVar1;
  
  this->data_ = other->data_;
  sVar1 = other->allocatedSize_;
  this->size_ = other->size_;
  this->allocatedSize_ = sVar1;
  other->data_ = (byte *)0x0;
  other->size_ = 0;
  other->allocatedSize_ = 0;
  return this;
}

Assistant:

ByteArray& ByteArray::operator=(ByteArray&& other)
{
	data_ = other.data_;
	size_ = other.size_;
	allocatedSize_ = other.allocatedSize_;
	other.data_ = nullptr;
	other.allocatedSize_ = other.size_ = 0;
	return *this;
}